

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfTportWeight.c
# Opt level: O2

void sbfTport_parseWeights(sbfTport tport)

{
  uint uVar1;
  sbfKeyValue psVar2;
  int iVar3;
  char *__s;
  char *pcVar4;
  ulong uVar5;
  sbfTportWeight *psVar6;
  ulong __n;
  uint uVar7;
  sbfLog psVar8;
  char *endptr;
  char pattern [256];
  char name [64];
  
  psVar2 = tport->mProperties;
  uVar7 = 0;
  do {
    if (uVar7 == 0xffff) {
      return;
    }
    snprintf(name,0x40,"weight%u",(ulong)uVar7);
    __s = (char *)sbfKeyValue_get(psVar2,name);
    if (__s != (char *)0x0) {
      pcVar4 = strchr(__s,0x2c);
      if (pcVar4 == (char *)0x0) {
        sbfLog_log(tport->mLog,2,"missing comma in weight%u property (%s)",uVar7,__s);
      }
      else {
        uVar5 = strtoul(pcVar4 + 1,&endptr,10);
        if ((uVar5 < 0x10000) && ((endptr == (char *)0x0 || (*endptr == '\0')))) {
          __n = (long)pcVar4 - (long)__s;
          if (__n < 0x100) {
            memcpy(pattern,__s,__n);
            pattern[__n] = '\0';
            psVar6 = (sbfTportWeight *)
                     sbfMemory_realloc(tport->mWeightsList,tport->mWeightsListSize + 1,0x48);
            tport->mWeightsList = psVar6;
            uVar1 = tport->mWeightsListSize;
            tport->mWeightsListSize = uVar1 + 1;
            iVar3 = regcomp((regex_t *)&psVar6[uVar1].mPattern,pattern,9);
            if (iVar3 == 0) {
              psVar6[uVar1].mWeight = (u_int)uVar5;
              sbfLog_log(tport->mLog,0,"weight pattern %s is %u",pattern,uVar5 & 0xffffffff);
            }
            else {
              sbfLog_log(tport->mLog,2,"weight%u pattern is invalid (%s)",uVar7,__s);
              tport->mWeightsListSize = tport->mWeightsListSize - 1;
            }
            goto LAB_00105f91;
          }
          psVar8 = tport->mLog;
          pcVar4 = "weight%u pattern is too long (%s)";
        }
        else {
          psVar8 = tport->mLog;
          pcVar4 = "bad number in weight%u property (%s)";
        }
        sbfLog_log(psVar8,2,pcVar4,uVar7,__s);
      }
    }
LAB_00105f91:
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

void
sbfTport_parseWeights (sbfTport tport)
{
    sbfKeyValue      properties = tport->mProperties;
    u_int            i;
    char             name[64];
    const char*      value;
    const char*      cp;
    char             pattern[256];
    unsigned long    ul;
    char*            endptr;
    sbfTportWeight*  w;

    for (i = 0; i < USHRT_MAX; i++)
    {
        snprintf (name, sizeof name, "weight%u", i);
        if ((value = sbfKeyValue_get (properties, name)) == NULL)
            continue;
        cp = strchr (value, ',');
        if (cp == NULL)
        {
            sbfLog_warn (tport->mLog,
                         "missing comma in weight%u property (%s)",
                         i,
                         value);
            continue;
        }

        ul = strtoul (cp + 1, &endptr, 10);
        if (ul > USHRT_MAX || (endptr != NULL && *endptr != '\0'))
        {
            sbfLog_warn (tport->mLog,
                         "bad number in weight%u property (%s)",
                         i,
                         value);
            continue;
        }

        if ((size_t)(cp - value) > (sizeof pattern) - 1)
        {
            sbfLog_warn (tport->mLog,
                         "weight%u pattern is too long (%s)",
                         i,
                         value);
            continue;
        }
        memcpy (pattern, value, cp - value);
        pattern[cp - value] = '\0';

        tport->mWeightsList = xrealloc (tport->mWeightsList,
                                        tport->mWeightsListSize + 1,
                                        sizeof *tport->mWeightsList);
        w = &tport->mWeightsList[tport->mWeightsListSize++];

        if (regcomp (&w->mPattern, pattern, REG_EXTENDED|REG_NOSUB) != 0)
        {
            sbfLog_warn (tport->mLog,
                         "weight%u pattern is invalid (%s)",
                         i,
                         value);
            tport->mWeightsListSize--;
            continue;
        }
        w->mWeight = ul;
        sbfLog_debug (tport->mLog,
                      "weight pattern %s is %u",
                      pattern,
                      w->mWeight);
    }

}